

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalGenerator::Compute(cmGlobalGenerator *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  pointer ppcVar5;
  ulong uVar6;
  ulong uVar7;
  pointer ppcVar8;
  pointer ppcVar9;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> autogenTargets;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> local_40;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->FilesReplacedDuringGenerate,
                    (this->FilesReplacedDuringGenerate).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->CMP0042WarnTargets)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->CMP0068WarnTargets)._M_t);
  iVar4 = (*this->_vptr_cmGlobalGenerator[0x2a])(this);
  if ((char)iVar4 == '\0') {
    bVar3 = false;
  }
  else {
    FinalizeTargetCompileInfo(this);
    CreateLocalGenerators(this);
    CreateGeneratorTargets(this,AllTargets);
    ComputeBuildFileGenerators(this);
    FillProjectMap(this);
    CreateQtAutoGeneratorsTargets(&local_40,this);
    ppcVar5 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->LocalGenerators).
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar5) {
      uVar6 = 0;
      uVar7 = 1;
      do {
        (*ppcVar5[uVar6]->_vptr_cmLocalGenerator[4])();
        ppcVar5 = (this->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        bVar3 = uVar7 < (ulong)((long)(this->LocalGenerators).
                                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar5 >>
                               3);
        uVar6 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar3);
    }
    ppcVar5 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppcVar9 = local_40.
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->LocalGenerators).
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar5) {
      uVar6 = 0;
      uVar7 = 1;
      do {
        bVar3 = cmLocalGenerator::ComputeTargetCompileFeatures(ppcVar5[uVar6]);
        if (!bVar3) goto LAB_003b7ed8;
        ppcVar5 = (this->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        bVar3 = uVar7 < (ulong)((long)(this->LocalGenerators).
                                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar5 >>
                               3);
        uVar6 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
        ppcVar9 = local_40.
                  super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (bVar3);
    }
    for (; ppcVar9 !=
           local_40.
           super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
           ._M_impl.super__Vector_impl_data._M_finish; ppcVar9 = ppcVar9 + 1) {
      cmQtAutoGeneratorInitializer::SetupAutoGenerateTarget(*ppcVar9);
    }
    ppcVar5 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->LocalGenerators).
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar5) {
      uVar6 = 0;
      do {
        pcVar1 = ppcVar5[uVar6]->Makefile;
        for (ppcVar8 = (pcVar1->InstallGenerators).
                       super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppcVar8 !=
            (pcVar1->InstallGenerators).
            super__Vector_base<cmInstallGenerator_*,_std::allocator<cmInstallGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_finish; ppcVar8 = ppcVar8 + 1) {
          (*((*ppcVar8)->super_cmScriptGenerator)._vptr_cmScriptGenerator[8])
                    (*ppcVar8,(this->LocalGenerators).
                              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar6]);
        }
        uVar6 = (ulong)((int)uVar6 + 1);
        ppcVar5 = (this->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (uVar6 < (ulong)((long)(this->LocalGenerators).
                                     super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar5 >> 3
                              ));
    }
    (*this->_vptr_cmGlobalGenerator[10])(this);
    ppcVar5 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->LocalGenerators).
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar5) {
      uVar6 = 0;
      uVar7 = 1;
      do {
        cmLocalGenerator::TraceDependencies(ppcVar5[uVar6]);
        ppcVar5 = (this->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        bVar3 = uVar7 < (ulong)((long)(this->LocalGenerators).
                                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar5 >>
                               3);
        uVar6 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar3);
    }
    (*this->_vptr_cmGlobalGenerator[0x2c])(this);
    ppcVar5 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->LocalGenerators).
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar5) {
      uVar6 = 0;
      uVar7 = 1;
      do {
        cmLocalGenerator::ComputeTargetManifest(ppcVar5[uVar6]);
        ppcVar5 = (this->LocalGenerators).
                  super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        bVar3 = uVar7 < (ulong)((long)(this->LocalGenerators).
                                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar5 >>
                               3);
        uVar6 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar3);
    }
    iVar4 = (*this->_vptr_cmGlobalGenerator[0x29])(this);
    if ((char)iVar4 == '\0') {
LAB_003b7ed8:
      bVar3 = false;
    }
    else {
      ppcVar5 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      bVar3 = true;
      if ((this->LocalGenerators).
          super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppcVar5) {
        uVar6 = 0;
        uVar7 = 1;
        do {
          (*ppcVar5[uVar6]->_vptr_cmLocalGenerator[3])();
          ppcVar5 = (this->LocalGenerators).
                    super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          bVar2 = uVar7 < (ulong)((long)(this->LocalGenerators).
                                        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar5
                                 >> 3);
          uVar6 = uVar7;
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (bVar2);
      }
    }
    if (local_40.
        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.
                      super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_40.
                            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.
                            super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return bVar3;
}

Assistant:

bool cmGlobalGenerator::Compute()
{
  // Some generators track files replaced during the Generate.
  // Start with an empty vector:
  this->FilesReplacedDuringGenerate.clear();

  // clear targets to issue warning CMP0042 for
  this->CMP0042WarnTargets.clear();
  // clear targets to issue warning CMP0068 for
  this->CMP0068WarnTargets.clear();

  // Check whether this generator is allowed to run.
  if (!this->CheckALLOW_DUPLICATE_CUSTOM_TARGETS()) {
    return false;
  }
  this->FinalizeTargetCompileInfo();

  this->CreateGenerationObjects();

  // at this point this->LocalGenerators has been filled,
  // so create the map from project name to vector of local generators
  this->FillProjectMap();

#ifdef CMAKE_BUILD_WITH_CMAKE
  // Iterate through all targets and set up automoc for those which have
  // the AUTOMOC, AUTOUIC or AUTORCC property set
  std::vector<cmGeneratorTarget const*> autogenTargets =
    this->CreateQtAutoGeneratorsTargets();
#endif

  unsigned int i;

  // Add generator specific helper commands
  for (i = 0; i < this->LocalGenerators.size(); ++i) {
    this->LocalGenerators[i]->AddHelperCommands();
  }

  // Finalize the set of compile features for each target.
  // FIXME: This turns into calls to cmMakefile::AddRequiredTargetFeature
  // which actually modifies the <lang>_STANDARD target property
  // on the original cmTarget instance.  It accumulates features
  // across all configurations.  Some refactoring is needed to
  // compute a per-config resulta purely during generation.
  for (i = 0; i < this->LocalGenerators.size(); ++i) {
    if (!this->LocalGenerators[i]->ComputeTargetCompileFeatures()) {
      return false;
    }
  }

#ifdef CMAKE_BUILD_WITH_CMAKE
  for (std::vector<cmGeneratorTarget const*>::iterator it =
         autogenTargets.begin();
       it != autogenTargets.end(); ++it) {
    cmQtAutoGeneratorInitializer::SetupAutoGenerateTarget(*it);
  }
#endif

  for (i = 0; i < this->LocalGenerators.size(); ++i) {
    cmMakefile* mf = this->LocalGenerators[i]->GetMakefile();
    std::vector<cmInstallGenerator*>& gens = mf->GetInstallGenerators();
    for (std::vector<cmInstallGenerator*>::const_iterator git = gens.begin();
         git != gens.end(); ++git) {
      (*git)->Compute(this->LocalGenerators[i]);
    }
  }

  this->AddExtraIDETargets();

  // Trace the dependencies, after that no custom commands should be added
  // because their dependencies might not be handled correctly
  for (i = 0; i < this->LocalGenerators.size(); ++i) {
    this->LocalGenerators[i]->TraceDependencies();
  }

  this->ForceLinkerLanguages();

  // Compute the manifest of main targets generated.
  for (i = 0; i < this->LocalGenerators.size(); ++i) {
    this->LocalGenerators[i]->ComputeTargetManifest();
  }

  // Compute the inter-target dependencies.
  if (!this->ComputeTargetDepends()) {
    return false;
  }

  for (i = 0; i < this->LocalGenerators.size(); ++i) {
    this->LocalGenerators[i]->ComputeHomeRelativeOutputPath();
  }

  return true;
}